

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

int __thiscall
ON_PolyCurve::IsPolyline
          (ON_PolyCurve *this,ON_SimpleArray<ON_3dPoint> *pline_points,
          ON_SimpleArray<double> *pline_t)

{
  uint uVar1;
  ON_Curve *pOVar2;
  double *pdVar3;
  ON_3dPoint *pOVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  double dVar8;
  ON_SimpleArray<double> seg_t;
  ON_SimpleArray<ON_3dPoint> seg_points;
  ON_Interval sdom;
  int local_ac;
  ON_SimpleArray<double> local_a0;
  ON_PolyCurve *local_88;
  ON_Interval local_80;
  ON_SimpleArray<ON_3dPoint> local_70;
  ulong local_58;
  ON_SimpleArray<double> *local_50;
  ON_SimpleArray<ON_3dPoint> *local_48;
  ON_Interval local_40;
  
  ON_Interval::ON_Interval(&local_40);
  ON_Interval::ON_Interval(&local_80);
  if ((pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) && (-1 < pline_points->m_capacity)) {
    pline_points->m_count = 0;
  }
  if ((pline_t != (ON_SimpleArray<double> *)0x0) && (-1 < pline_t->m_capacity)) {
    pline_t->m_count = 0;
  }
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_58 = (ulong)uVar1;
  if (local_58 == 1) {
    pOVar2 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
    if (pOVar2 != (ON_Curve *)0x0) {
      iVar5 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2f])
                        (pOVar2,pline_points,pline_t);
      if (pline_t == (ON_SimpleArray<double> *)0x0) {
        return iVar5;
      }
      if (iVar5 < 1) {
        return iVar5;
      }
      pdVar3 = (this->m_t).m_a;
      dVar8 = pdVar3[1];
      ON_Interval::Set(&local_40,*pdVar3,dVar8);
      (*((*(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a)->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x25])();
      local_80.m_t[1] = dVar8;
      for (lVar6 = 0; lVar6 < pline_t->m_count; lVar6 = lVar6 + 1) {
        dVar8 = ON_Interval::TransformParameterTo(&local_80,&local_40,pline_t->m_a[lVar6]);
        pline_t->m_a[lVar6] = dVar8;
      }
      return iVar5;
    }
  }
  else if (1 < (int)uVar1) {
    local_48 = &local_70;
    local_70._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081b0f0;
    local_70.m_a = (ON_3dPoint *)0x0;
    local_70.m_count = 0;
    local_70.m_capacity = 0;
    if (pline_points == (ON_SimpleArray<ON_3dPoint> *)0x0) {
      local_48 = (ON_SimpleArray<ON_3dPoint> *)0x0;
    }
    local_50 = &local_a0;
    local_a0._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081c348;
    local_a0.m_a = (double *)0x0;
    local_a0.m_count = 0;
    local_a0.m_capacity = 0;
    if (pline_t == (ON_SimpleArray<double> *)0x0) {
      local_50 = (ON_SimpleArray<double> *)0x0;
    }
    uVar7 = 0;
    local_ac = 0;
    local_88 = this;
    do {
      if (uVar7 == local_58) {
LAB_00592954:
        iVar5 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])
                          (this);
        if (((char)iVar5 == '\x01' && pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) &&
           (lVar6 = (long)pline_points->m_count, 3 < lVar6)) {
          pOVar4 = pline_points->m_a;
          pOVar4[lVar6 + -1].z = pOVar4->z;
          dVar8 = pOVar4->y;
          pOVar4[lVar6 + -1].x = pOVar4->x;
          pOVar4[lVar6 + -1].y = dVar8;
        }
        ON_SimpleArray<double>::~ON_SimpleArray(&local_a0);
        ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&local_70);
        return local_ac;
      }
      if (-1 < (long)local_70._16_8_) {
        local_70._16_8_ = local_70._16_8_ & 0xffffffff00000000;
      }
      if (-1 < (long)local_a0._16_8_) {
        local_a0._16_8_ = local_a0._16_8_ & 0xffffffff00000000;
      }
      pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar7];
      iVar5 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2f])
                        (pOVar2,local_48,local_50);
      if (iVar5 < 2) {
        if ((pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) && (-1 < pline_points->m_capacity))
        {
          pline_points->m_count = 0;
        }
        local_ac = 0;
        if ((pline_t != (ON_SimpleArray<double> *)0x0) && (-1 < pline_t->m_capacity)) {
          pline_t->m_count = 0;
        }
        goto LAB_00592954;
      }
      if (pline_t != (ON_SimpleArray<double> *)0x0) {
        pdVar3 = (this->m_t).m_a;
        dVar8 = pdVar3[uVar7 + 1];
        ON_Interval::Set(&local_40,pdVar3[uVar7],dVar8);
        (*((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar7]->super_ON_Geometry).
          super_ON_Object._vptr_ON_Object[0x25])();
        local_80.m_t[1] = dVar8;
        for (lVar6 = 0; lVar6 < local_a0.m_count; lVar6 = lVar6 + 1) {
          dVar8 = ON_Interval::TransformParameterTo(&local_80,&local_40,local_a0.m_a[lVar6]);
          local_a0.m_a[lVar6] = dVar8;
        }
        if (0 < pline_t->m_count) {
          (*pline_t->_vptr_ON_SimpleArray[2])(pline_t,(ulong)(pline_t->m_count - 1));
        }
        this = local_88;
        ON_SimpleArray<double>::Append(pline_t,local_a0.m_count,local_a0.m_a);
      }
      if (pline_points != (ON_SimpleArray<ON_3dPoint> *)0x0) {
        if (0 < pline_points->m_count) {
          (*pline_points->_vptr_ON_SimpleArray[2])(pline_points,(ulong)(pline_points->m_count - 1));
        }
        ON_SimpleArray<ON_3dPoint>::Append(pline_points,local_70.m_count,local_70.m_a);
      }
      local_ac = local_ac + -1 + (uint)(uVar7 == 0) + iVar5;
      uVar7 = uVar7 + 1;
    } while( true );
  }
  return 0;
}

Assistant:

int ON_PolyCurve::IsPolyline(
      ON_SimpleArray<ON_3dPoint>* pline_points,
      ON_SimpleArray<double>* pline_t
      ) const
{
  int i, seg_i, seg_rc;
  ON_Interval sdom, cdom;
  int rc = 0;
  if ( pline_points )
    pline_points->SetCount(0);
  if ( pline_t )
    pline_t->SetCount(0);
  const int seg_count = Count();
  if ( seg_count == 1 )
  {
    if ( m_segment[0] )
      rc = m_segment[0]->IsPolyline(pline_points,pline_t);
    if (pline_t && rc > 0)
    {
      sdom.Set(m_t[0],m_t[1]);
      cdom = m_segment[0]->Domain();
      for ( i = 0; i < pline_t->Count(); i++ )
        (*pline_t)[i] = cdom.TransformParameterTo(sdom, (*pline_t)[i]);
    }
  }
  else if (seg_count > 1 )
  {
    ON_SimpleArray<ON_3dPoint> seg_points;
    ON_SimpleArray<double> seg_t;
    for ( seg_i = 0; seg_i < seg_count; seg_i++ )
    {
      seg_points.SetCount(0);
      seg_t.SetCount(0);
      seg_rc = m_segment[seg_i]->IsPolyline(pline_points?&seg_points:0,pline_t?&seg_t:0);
      if ( seg_rc < 2 )
      {
        if ( pline_points )
          pline_points->SetCount(0);
        if ( pline_t )
          pline_t->SetCount(0);
        rc = 0;
        break;
      }
      rc += seg_rc;
      if ( seg_i )
        rc--;
      if ( pline_t )
      {
        sdom.Set( m_t[seg_i], m_t[seg_i+1] );
        cdom = m_segment[seg_i]->Domain();

        for (i = 0; i < seg_t.Count(); i++)
          seg_t[i] = cdom.TransformParameterTo(sdom, seg_t[i]);

        if ( pline_t->Count() > 0 )
          pline_t->Remove();
        pline_t->Append( seg_t.Count(), seg_t.Array() );
      }
      if ( pline_points )
      {
        if ( pline_points->Count() > 0 )
          pline_points->Remove();
        pline_points->Append( seg_points.Count(), seg_points.Array() );
      }
    }
    if(IsClosed() && pline_points && pline_points->Count() > 3)
    {
      // GBA 2/26/03. Make closed polylines spot on closed
      *pline_points->Last() = *pline_points->First();
    }
  }
  return rc;
}